

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O1

_Bool SystemZ_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  byte bVar1;
  cs_detail *__s;
  DecodeStatus DVar2;
  uint8_t *orig_p;
  uint8_t *puVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint8_t *puVar8;
  void *Decoder;
  uint64_t Value;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint64_t Value_4;
  long lVar12;
  uint8_t *orig_p_2;
  byte *pbVar13;
  ulong insn;
  bool bVar14;
  DecodeStatus local_3c;
  
  bVar4 = *code;
  bVar14 = 0xbf < bVar4;
  puVar8 = DecoderTable48;
  if (!bVar14) {
    puVar8 = "\x01\x18\b\x02@\x04";
  }
  uVar5 = 2;
  if (0x3f < bVar4) {
    uVar5 = (ulong)(bVar14 + 4 + (uint)bVar14);
  }
  puVar3 = "\x01\b\b\x02\x01T";
  if (0x3f < bVar4) {
    puVar3 = puVar8;
  }
  *size = (uint16_t)uVar5;
  if (code_len < uVar5) {
LAB_00249cb0:
    return false;
  }
  __s = MI->flat_insn->detail;
  if (__s != (cs_detail *)0x0) {
    memset(__s,0,0x120);
  }
  uVar5 = 0;
  if ((ulong)*size == 0) {
    insn = 0;
  }
  else {
    uVar6 = 0;
    insn = 0;
    do {
      insn = insn << 8 | (ulong)code[uVar6];
      uVar6 = uVar6 + 1;
    } while (*size != uVar6);
  }
  local_3c = MCDisassembler_Success;
  Decoder = (void *)0xffffffffffffffff;
LAB_00249aa0:
  do {
LAB_00249aa3:
    puVar8 = puVar3;
    switch(*puVar8) {
    case '\x01':
      goto switchD_00249ab6_caseD_1;
    case '\x02':
      uVar6 = 0;
      uVar9 = 0;
      bVar4 = 0;
      do {
        lVar7 = uVar6 + 1;
        uVar9 = uVar9 + ((ulong)(puVar8[lVar7] & 0x7f) << (bVar4 & 0x3f));
        bVar4 = bVar4 + 7;
        uVar6 = uVar6 + 1;
      } while ((char)puVar8[lVar7] < '\0');
      puVar3 = puVar8 + (uVar6 & 0xffffffff) + 3;
      if (uVar9 != (uVar5 & 0xffffffff)) {
        puVar3 = puVar8 + (uVar6 & 0xffffffff) + 3 + *(ushort *)(puVar8 + (uVar6 & 0xffffffff) + 1);
      }
      goto LAB_00249aa3;
    case '\x03':
      uVar6 = ~(-1L << (puVar8[2] & 0x3f)) << (puVar8[1] & 0x3f);
      if (puVar8[2] == 0x40) {
        uVar6 = 0xffffffffffffffff;
      }
      uVar10 = 0;
      uVar9 = 0;
      bVar4 = 0;
      do {
        lVar7 = uVar10 + 3;
        uVar9 = uVar9 + ((ulong)(puVar8[lVar7] & 0x7f) << (bVar4 & 0x3f));
        bVar4 = bVar4 + 7;
        uVar10 = uVar10 + 1;
      } while ((char)puVar8[lVar7] < '\0');
      puVar3 = puVar8 + (uVar10 & 0xffffffff) + 5;
      if ((uVar9 & 0xffffffff) != (uVar6 & insn) >> (puVar8[1] & 0x3f)) {
        puVar3 = puVar8 + (uVar10 & 0xffffffff) + 5 +
                 *(ushort *)(puVar8 + (uVar10 & 0xffffffff) + 3);
      }
      goto LAB_00249aa3;
    case '\x04':
      uVar6 = 0;
      do {
        lVar7 = uVar6 + 1;
        uVar6 = uVar6 + 1;
      } while ((char)puVar8[lVar7] < '\0');
      puVar3 = puVar8 + (uVar6 & 0xffffffff) + 3;
      goto LAB_00249aa3;
    case '\x05':
      uVar5 = 0;
      lVar7 = 0;
      bVar4 = 0;
      do {
        lVar12 = uVar5 + 1;
        lVar7 = lVar7 + ((ulong)(puVar8[lVar12] & 0x7f) << (bVar4 & 0x3f));
        bVar4 = bVar4 + 7;
        uVar5 = uVar5 + 1;
      } while ((char)puVar8[lVar12] < '\0');
      pbVar13 = puVar8 + (uVar5 & 0xffffffff) + 1;
      lVar12 = 0;
      bVar4 = 0;
      do {
        bVar1 = *pbVar13;
        lVar12 = lVar12 + ((ulong)(bVar1 & 0x7f) << (bVar4 & 0x3f));
        bVar4 = bVar4 + 7;
        pbVar13 = pbVar13 + 1;
      } while ((char)bVar1 < '\0');
      MCInst_setOpcode(MI,(uint)lVar7);
      DVar2 = decodeToMCInst(local_3c,(uint)lVar12,insn,MI,address,Decoder);
      return DVar2 != MCDisassembler_Fail;
    case '\x06':
      uVar9 = 0;
      uVar6 = 0;
      bVar4 = 0;
      do {
        lVar7 = uVar9 + 1;
        uVar6 = uVar6 + ((ulong)(puVar8[lVar7] & 0x7f) << (bVar4 & 0x3f));
        bVar4 = bVar4 + 7;
        uVar9 = uVar9 + 1;
      } while ((char)puVar8[lVar7] < '\0');
      uVar11 = 0;
      uVar10 = 0;
      bVar4 = 0;
      do {
        lVar7 = uVar11 + (uVar9 & 0xffffffff) + 1;
        uVar10 = uVar10 + ((ulong)(puVar8[lVar7] & 0x7f) << (bVar4 & 0x3f));
        bVar4 = bVar4 + 7;
        uVar11 = uVar11 + 1;
      } while ((char)puVar8[lVar7] < '\0');
      puVar3 = puVar8 + (uVar11 & 0xffffffff) + (uVar9 & 0xffffffff) + 1;
      if ((uVar10 & ~insn) != 0 || (uVar6 & insn) != 0) {
        local_3c = MCDisassembler_SoftFail;
      }
      break;
    default:
      goto LAB_00249cb0;
    }
  } while( true );
switchD_00249ab6_caseD_1:
  puVar3 = puVar8 + 3;
  uVar5 = ~(-1L << (puVar8[2] & 0x3f)) << (puVar8[1] & 0x3f);
  if (puVar8[2] == 0x40) {
    uVar5 = 0xffffffffffffffff;
  }
  uVar5 = (uVar5 & insn) >> (puVar8[1] & 0x3f);
  goto LAB_00249aa0;
}

Assistant:

bool SystemZ_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *MI,
		uint16_t *size, uint64_t address, void *info)
{
	uint64_t Inst;
	const uint8_t *Table;
	uint16_t I; 

	// The top 2 bits of the first byte specify the size.
	if (*code < 0x40) {
		*size = 2;
		Table = DecoderTable16;
	} else if (*code < 0xc0) {
		*size = 4;
		Table = DecoderTable32;
	} else {
		*size = 6;
		Table = DecoderTable48;
	}

	if (code_len < *size)
		// short of input data
		return false;

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, offsetof(cs_detail, sysz)+sizeof(cs_sysz));
	}

	// Construct the instruction.
	Inst = 0;
	for (I = 0; I < *size; ++I)
		Inst = (Inst << 8) | code[I];

	return decodeInstruction(Table, MI, Inst, address, info, 0);
}